

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestCallback::toApp(TestCallback *this,Message *message,SessionID *param_2)

{
  bool bVar1;
  DoNotSend *this_00;
  FieldMap *pFVar2;
  string *psVar3;
  char *pcVar4;
  undefined1 local_180 [8];
  MsgType msgType;
  undefined1 local_118 [8];
  PossDupFlag possDupFlag;
  string local_b0;
  undefined1 local_80 [8];
  Text text;
  SessionID *param_2_local;
  Message *message_local;
  TestCallback *this_local;
  
  text.super_StringField.super_FieldBase.m_metrics._8_8_ = param_2;
  if (this->checkForDoNotSend != 0) {
    FIX::Text::Text((Text *)local_80);
    bVar1 = FIX::FieldMap::getFieldIfSet((FieldMap *)message,(FieldBase *)local_80);
    if ((bVar1) && (bVar1 = FIX::operator==((StringField *)local_80,"DoNotSend"), bVar1)) {
      possDupFlag.super_BoolField.super_FieldBase.m_metrics._14_1_ = 1;
      this_00 = (DoNotSend *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"",
                 (allocator<char> *)&possDupFlag.super_BoolField.super_FieldBase.m_metrics.field_0xf
                );
      FIX::DoNotSend::DoNotSend(this_00,&local_b0);
      possDupFlag.super_BoolField.super_FieldBase.m_metrics._14_1_ = 0;
      __cxa_throw(this_00,&FIX::DoNotSend::typeinfo,FIX::DoNotSend::~DoNotSend);
    }
    FIX::Text::~Text((Text *)local_80);
  }
  msgType.super_StringField.super_FieldBase.m_metrics._15_1_ = 0;
  FIX::PossDupFlag::PossDupFlag
            ((PossDupFlag *)local_118,
             (BOOLEAN *)&msgType.super_StringField.super_FieldBase.m_metrics.field_0xf);
  pFVar2 = &FIX::Message::getHeader(message)->super_FieldMap;
  bVar1 = FIX::FieldMap::isSetField(pFVar2,(FieldBase *)local_118);
  if (bVar1) {
    pFVar2 = &FIX::Message::getHeader(message)->super_FieldMap;
    FIX::FieldMap::getField(pFVar2,(FieldBase *)local_118);
  }
  bVar1 = FIX::BoolField::operator_cast_to_bool((BoolField *)local_118);
  if (bVar1) {
    this->resent = this->resent + 1;
    FIX::Message::operator=(&this->lastResent,message);
  }
  FIX::MsgType::MsgType((MsgType *)local_180);
  pFVar2 = &FIX::Message::getHeader(message)->super_FieldMap;
  FIX::FieldMap::getField(pFVar2,(FieldBase *)local_180);
  psVar3 = FIX::StringField::getValue_abi_cxx11_((StringField *)local_180);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar3);
  if (*pcVar4 == 'j') {
    this->toBusinessMessageReject = this->toBusinessMessageReject + 1;
  }
  FIX::MsgType::~MsgType((MsgType *)local_180);
  FIX::PossDupFlag::~PossDupFlag((PossDupFlag *)local_118);
  return;
}

Assistant:

EXCEPT( DoNotSend )
  {
    if(checkForDoNotSend) {
      FIX::Text text;
      if(message.getFieldIfSet(text) && text == "DoNotSend") {
        throw DoNotSend();
      }
    }

    PossDupFlag possDupFlag(false);
    if( message.getHeader().isSetField(possDupFlag) )
      message.getHeader().getField( possDupFlag );
    if( possDupFlag ) 
    {
      resent++;
      lastResent = message;
    }

    MsgType msgType;
    message.getHeader().getField( msgType );
    switch ( msgType.getValue() [ 0 ] )
    {
      case 'j':
      toBusinessMessageReject++; break;
    }
  }